

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanWellKnownToken
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  bool bVar2;
  char16 local_22;
  bool endFound;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLStack_20;
  char16 c;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *charList_local;
  TextFormatReader *this_local;
  
  local_22 = L'\0';
  bVar1 = false;
  pLStack_20 = charList;
  charList_local =
       (List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)this;
  do {
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_22);
    if (!bVar2) {
LAB_00d01b95:
      if (bVar1) {
        this_local._4_4_ = WellKnownToken;
      }
      else {
        this_local._4_4_ = Error;
      }
      return this_local._4_4_;
    }
    if (local_22 == L'\0') {
      return Error;
    }
    if (local_22 == L'~') {
      bVar1 = true;
      goto LAB_00d01b95;
    }
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (pLStack_20,&local_22);
  } while( true );
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanWellKnownToken(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        bool endFound = false;

        while(this->ReadRawChar(&c))
        {
            if(c == 0)
            {
                return NSTokens::ParseTokenKind::Error;
            }

            if(c == _u('~'))
            {
                //end of the string
                endFound = true;
                break;
            }
            else
            {
                charList.Add(c);
            }
        }

        if(!endFound)
        {
            // no ending found
            return NSTokens::ParseTokenKind::Error;
        }

        return NSTokens::ParseTokenKind::WellKnownToken;
    }